

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *
remap_pls(vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
          *__return_storage_ptr__,SmallVector<PLSArg,_8UL> *pls_variables,
         SmallVector<spirv_cross::Resource,_8UL> *resources,
         SmallVector<spirv_cross::Resource,_8UL> *secondary_resources)

{
  pointer *ppPVar1;
  size_t sVar2;
  Resource *pRVar3;
  size_t sVar4;
  iterator iVar5;
  PlsRemap PVar6;
  PlsRemap PVar7;
  bool bVar8;
  int iVar9;
  PLSArg *pPVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  SmallVector<spirv_cross::Resource,_8UL> *__range2;
  SmallVector<spirv_cross::Resource,_8UL> *__range3;
  PlsRemap local_50;
  PLSArg *local_48;
  SmallVector<spirv_cross::Resource,_8UL> *local_40;
  SmallVector<spirv_cross::Resource,_8UL> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sVar2 = (pls_variables->super_VectorView<PLSArg>).buffer_size;
  if (sVar2 != 0) {
    pPVar10 = (pls_variables->super_VectorView<PLSArg>).ptr;
    local_48 = pPVar10 + sVar2;
    local_40 = resources;
    local_38 = secondary_resources;
    do {
      sVar2 = (local_40->super_VectorView<spirv_cross::Resource>).buffer_size;
      if (sVar2 == 0) {
        bVar8 = false;
      }
      else {
        pRVar3 = (local_40->super_VectorView<spirv_cross::Resource>).ptr;
        lVar11 = 0;
        bVar8 = false;
        do {
          sVar4 = *(size_t *)((long)&(pRVar3->name)._M_string_length + lVar11);
          if (sVar4 == (pPVar10->name)._M_string_length) {
            if (sVar4 == 0) {
              bVar12 = true;
            }
            else {
              iVar9 = bcmp(*(void **)((long)&(pRVar3->name)._M_dataplus._M_p + lVar11),
                           (pPVar10->name)._M_dataplus._M_p,sVar4);
              bVar12 = iVar9 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if (bVar12) {
            local_50.id = *(uint32_t *)((long)&(pRVar3->id).id + lVar11);
            local_50.format = pPVar10->format;
            iVar5._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
              _M_realloc_insert<spirv_cross::PlsRemap>(__return_storage_ptr__,iVar5,&local_50);
            }
            else {
              PVar6.format = local_50.format;
              PVar6.id = local_50.id;
              *iVar5._M_current = PVar6;
              ppPVar1 = &(__return_storage_ptr__->
                         super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            bVar8 = true;
          }
          bVar13 = sVar2 * 0x30 + -0x30 == lVar11;
          lVar11 = lVar11 + 0x30;
        } while (!(bool)(bVar12 | bVar13));
      }
      if ((local_38 != (SmallVector<spirv_cross::Resource,_8UL> *)0x0 && !bVar8) &&
         (sVar2 = (local_38->super_VectorView<spirv_cross::Resource>).buffer_size, sVar2 != 0)) {
        pRVar3 = (local_38->super_VectorView<spirv_cross::Resource>).ptr;
        lVar11 = 0;
        do {
          sVar4 = *(size_t *)((long)&(pRVar3->name)._M_string_length + lVar11);
          if (sVar4 == (pPVar10->name)._M_string_length) {
            if (sVar4 == 0) {
              bVar12 = true;
            }
            else {
              iVar9 = bcmp(*(void **)((long)&(pRVar3->name)._M_dataplus._M_p + lVar11),
                           (pPVar10->name)._M_dataplus._M_p,sVar4);
              bVar12 = iVar9 == 0;
            }
          }
          else {
            bVar12 = false;
          }
          if (bVar12) {
            local_50.id = *(uint32_t *)((long)&(pRVar3->id).id + lVar11);
            local_50.format = pPVar10->format;
            iVar5._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar5._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
              _M_realloc_insert<spirv_cross::PlsRemap>(__return_storage_ptr__,iVar5,&local_50);
            }
            else {
              PVar7.format = local_50.format;
              PVar7.id = local_50.id;
              *iVar5._M_current = PVar7;
              ppPVar1 = &(__return_storage_ptr__->
                         super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            bVar8 = true;
          }
          bVar13 = sVar2 * 0x30 + -0x30 == lVar11;
          lVar11 = lVar11 + 0x30;
        } while (!(bool)(bVar12 | bVar13));
      }
      if (!bVar8) {
        remap_pls();
      }
      pPVar10 = pPVar10 + 1;
    } while (pPVar10 != local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

static vector<PlsRemap> remap_pls(const SmallVector<PLSArg> &pls_variables, const SmallVector<Resource> &resources,
                                  const SmallVector<Resource> *secondary_resources)
{
	vector<PlsRemap> ret;

	for (auto &pls : pls_variables)
	{
		bool found = false;
		for (auto &res : resources)
		{
			if (res.name == pls.name)
			{
				ret.push_back({ res.id, pls.format });
				found = true;
				break;
			}
		}

		if (!found && secondary_resources)
		{
			for (auto &res : *secondary_resources)
			{
				if (res.name == pls.name)
				{
					ret.push_back({ res.id, pls.format });
					found = true;
					break;
				}
			}
		}

		if (!found)
			fprintf(stderr, "Did not find stage input/output/target with name \"%s\".\n", pls.name.c_str());
	}

	return ret;
}